

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

MeshAttributeIndicesEncodingData * __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::GetAttributeEncodingData
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,int att_id)

{
  int32_t iVar1;
  int iVar2;
  PointCloudDecoder *this_00;
  PointCloudDecoder *pPVar3;
  const_reference pvVar4;
  AttributesDecoderInterface *pAVar5;
  int in_ESI;
  long in_RDI;
  int j;
  AttributesDecoderInterface *dec;
  int decoder_id;
  uint32_t i;
  uint local_2c;
  uint local_18;
  
  local_18 = 0;
  do {
    this_00 = (PointCloudDecoder *)(ulong)local_18;
    pPVar3 = (PointCloudDecoder *)
             std::
             vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
             ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                     *)(in_RDI + 0x1f8));
    if (pPVar3 <= this_00) {
      return (MeshAttributeIndicesEncodingData *)(in_RDI + 0x1b8);
    }
    pvVar4 = std::
             vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
             ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                           *)(in_RDI + 0x1f8),(ulong)local_18);
    iVar2 = pvVar4->decoder_id;
    if ((-1 < iVar2) &&
       (iVar1 = PointCloudDecoder::num_attributes_decoders((PointCloudDecoder *)0x151bd4),
       iVar2 < iVar1)) {
      pAVar5 = PointCloudDecoder::attributes_decoder(this_00,iVar2);
      for (local_2c = 0; iVar2 = (*pAVar5->_vptr_AttributesDecoderInterface[6])(),
          (int)local_2c < iVar2; local_2c = local_2c + 1) {
        iVar2 = (*pAVar5->_vptr_AttributesDecoderInterface[5])(pAVar5,(ulong)local_2c);
        if (iVar2 == in_ESI) {
          pvVar4 = std::
                   vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                                 *)(in_RDI + 0x1f8),(ulong)local_18);
          return &pvVar4->encoding_data;
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

const MeshAttributeIndicesEncodingData *
MeshEdgebreakerDecoderImpl<TraversalDecoder>::GetAttributeEncodingData(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    const int decoder_id = attribute_data_[i].decoder_id;
    if (decoder_id < 0 || decoder_id >= decoder_->num_attributes_decoders()) {
      continue;
    }
    const AttributesDecoderInterface *const dec =
        decoder_->attributes_decoder(decoder_id);
    for (int j = 0; j < dec->GetNumAttributes(); ++j) {
      if (dec->GetAttributeId(j) == att_id) {
        return &attribute_data_[i].encoding_data;
      }
    }
  }
  return &pos_encoding_data_;
}